

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationAddress.h
# Opt level: O2

void __thiscall
DIS::SimulationManagementPduHeader::setRecevingID(SimulationManagementPduHeader *this,EntityID *pX)

{
  unsigned_short uVar1;
  
  uVar1 = (pX->_simulationAddress)._application;
  (this->_recevingID)._simulationAddress._site = (pX->_simulationAddress)._site;
  (this->_recevingID)._simulationAddress._application = uVar1;
  (this->_recevingID)._entityNumber = pX->_entityNumber;
  return;
}

Assistant:

class OPENDIS7_EXPORT SimulationAddress
{
protected:
  /** A site is defined as a facility, installation, organizational unit or a geographic location that has one or more simulation applications capable of participating in a distributed event.  */
  unsigned short _site; 

  /** An application is defined as a software program that is used to generate and process distributed simulation data including live, virtual and constructive data. */
  unsigned short _application; 


 public:
    SimulationAddress();
    virtual ~SimulationAddress();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getSite() const; 
    void setSite(unsigned short pX); 

    unsigned short getApplication() const; 
    void setApplication(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const SimulationAddress& rhs) const;
}